

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.h
# Opt level: O0

void __thiscall wallet::CWallet::~CWallet(CWallet *this)

{
  void *in_RDI;
  long in_FS_OFFSET;
  CWallet *this_00;
  
  this_00 = *(CWallet **)(in_FS_OFFSET + 0x28);
  ~CWallet(this_00);
  operator_delete(in_RDI,0x4a8);
  if (*(CWallet **)(in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~CWallet()
    {
        // Should not have slots connected at this point.
        assert(NotifyUnload.empty());
    }